

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::ComputeSolutionHCurlT<double>
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<double> *sol,TPZSolVec<double> *curlSol)

{
  double dVar1;
  long lVar2;
  TPZManVector<double,_10> *pTVar3;
  TNode *pTVar4;
  double *pdVar5;
  int iVar6;
  long *plVar7;
  TPZCompMesh *pTVar8;
  TPZFMatrix<double> *pTVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double extraout_XMM0_Qa;
  long local_90;
  double local_58;
  TPZCompMesh *local_50;
  long local_48;
  long local_40;
  TPZFMatrix<double> *local_38;
  
  local_38 = curlPhi;
  plVar7 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar7 + 0x78))(plVar7);
  iVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  pTVar8 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar9 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fSolution);
  lVar2 = (pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(sol,lVar2);
  (*(curlSol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(curlSol,lVar2);
  if (0 < lVar2) {
    lVar13 = 0;
    lVar10 = lVar2;
    do {
      pTVar3 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar13 + -0x20) + 0x18))
                ((long)pTVar3->fExtAlloc + lVar13 + -0x20,1);
      local_58 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                 lVar13 + -0x20),&local_58,0,-1);
      pTVar3 = (curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar13 + -0x20) + 0x18))
                ((long)pTVar3->fExtAlloc + lVar13 + -0x20,1);
      local_58 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                 lVar13 + -0x20),&local_58,0,-1);
      lVar13 = lVar13 + 0x70;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  local_50 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (0 < iVar6) {
    lVar10 = 0;
    iVar11 = 0;
    do {
      lVar13 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar11);
      pTVar4 = (local_50->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      local_40 = (long)pTVar4[*(int *)(lVar13 + 8)].dim;
      if (0 < local_40) {
        local_48 = (long)pTVar4[*(int *)(lVar13 + 8)].pos;
        lVar10 = (long)(int)lVar10;
        local_90 = 0;
        do {
          if (0 < lVar2) {
            lVar13 = local_90 + local_48;
            lVar12 = 8;
            lVar14 = 0;
            do {
              if (((lVar13 < 0) ||
                  ((pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar13)) ||
                 ((pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((lVar10 < 0) ||
                  ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10)) ||
                 ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x278);
              }
              pdVar5 = *(double **)
                        ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                        lVar12 + -0x20);
              *pdVar5 = pTVar9->fElem
                        [(pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar14 +
                         lVar13] * phiHCurl->fElem[lVar10] + *pdVar5;
              if (((lVar13 < 0) ||
                  ((pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar13)) ||
                 ((pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar1 = pTVar9->fElem
                      [(pTVar9->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar14 + lVar13]
              ;
              (*(local_38->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x21])(local_38,0,lVar10);
              pdVar5 = *(double **)
                        ((long)((curlSol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->
                               fExtAlloc + lVar12 + -0x20);
              *pdVar5 = extraout_XMM0_Qa * dVar1 + *pdVar5;
              lVar14 = lVar14 + 1;
              lVar12 = lVar12 + 0x70;
            } while (lVar2 != lVar14);
          }
          lVar10 = lVar10 + 1;
          local_90 = local_90 + 1;
        } while (local_90 != local_40);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar6);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}